

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O0

int nifti_hdr_looks_good(nifti_1_header *hdr)

{
  int iVar1;
  int local_2c;
  int local_24;
  uint local_20;
  int errs;
  int c;
  int is_nifti;
  nifti_1_header *hdr_local;
  
  local_24 = 0;
  iVar1 = need_nhdr_swap(hdr->dim[0],hdr->sizeof_hdr);
  if (iVar1 < 0) {
    if (0 < g_opts.debug) {
      fprintf(_stderr,"** bad nhdr fields: dim0, sizeof_hdr = %d, %d\n",
              (ulong)(uint)(int)hdr->dim[0],(ulong)(uint)hdr->sizeof_hdr);
    }
    local_24 = 1;
  }
  for (local_20 = 1; (int)local_20 <= (int)hdr->dim[0] && (int)local_20 < 8; local_20 = local_20 + 1
      ) {
    if (hdr->dim[(int)local_20] < 1) {
      if (0 < g_opts.debug) {
        fprintf(_stderr,"** bad nhdr field: dim[%d] = %d\n",(ulong)local_20,
                (ulong)(uint)(int)hdr->dim[(int)local_20]);
      }
      local_24 = local_24 + 1;
    }
  }
  if ((((hdr->magic[0] == 'n') && (hdr->magic[3] == '\0')) &&
      ((hdr->magic[1] == 'i' || (hdr->magic[1] == '+')))) &&
     (('0' < hdr->magic[2] && (hdr->magic[2] < ':')))) {
    local_2c = hdr->magic[2] + -0x30;
  }
  else {
    local_2c = 0;
  }
  if (local_2c == 0) {
    if (1 < g_opts.debug) {
      fprintf(_stderr,"-- nhdr magic field implies ANALYZE: magic = \'%.4s\'\n",hdr->magic);
    }
    iVar1 = nifti_datatype_is_valid((int)hdr->datatype,0);
    if (iVar1 == 0) {
      if (0 < g_opts.debug) {
        fprintf(_stderr,"** bad ANALYZE datatype in hdr, %d\n",(ulong)(uint)(int)hdr->datatype);
      }
      local_24 = local_24 + 1;
    }
  }
  else {
    iVar1 = nifti_datatype_is_valid((int)hdr->datatype,1);
    if (iVar1 == 0) {
      if (0 < g_opts.debug) {
        fprintf(_stderr,"** bad NIFTI datatype in hdr, %d\n",(ulong)(uint)(int)hdr->datatype);
      }
      local_24 = local_24 + 1;
    }
  }
  if (local_24 == 0) {
    if (2 < g_opts.debug) {
      fprintf(_stderr,"-d nifti header looks good\n");
    }
    hdr_local._4_4_ = 1;
  }
  else {
    hdr_local._4_4_ = 0;
  }
  return hdr_local._4_4_;
}

Assistant:

int nifti_hdr_looks_good(const nifti_1_header * hdr)
{
   int is_nifti, c, errs = 0;

   /* check dim[0] and sizeof_hdr */
   if( need_nhdr_swap(hdr->dim[0], hdr->sizeof_hdr) < 0 ){
      if( g_opts.debug > 0 )
         fprintf(stderr,"** bad nhdr fields: dim0, sizeof_hdr = %d, %d\n",
                 hdr->dim[0], hdr->sizeof_hdr);
      errs++;
   }

   /* check the valid dimension sizes (maybe dim[0] is bad) */
   for( c = 1; c <= hdr->dim[0] && c <= 7; c++ )
      if( hdr->dim[c] <= 0 ){
         if( g_opts.debug > 0 )
            fprintf(stderr,"** bad nhdr field: dim[%d] = %d\n",c,hdr->dim[c]);
         errs++;
      }

   is_nifti = NIFTI_VERSION(*hdr);      /* determine header type */

   if( is_nifti ){      /* NIFTI */

      if( ! nifti_datatype_is_valid(hdr->datatype, 1) ){
         if( g_opts.debug > 0 )
            fprintf(stderr,"** bad NIFTI datatype in hdr, %d\n",hdr->datatype);
         errs++;
      }

   } else {             /* ANALYZE 7.5 */

      if( g_opts.debug > 1 )  /* maybe tell user it's an ANALYZE hdr */
         fprintf(stderr,
            "-- nhdr magic field implies ANALYZE: magic = '%.4s'\n",hdr->magic);

      if( ! nifti_datatype_is_valid(hdr->datatype, 0) ){
         if( g_opts.debug > 0 )
           fprintf(stderr,"** bad ANALYZE datatype in hdr, %d\n",hdr->datatype);
         errs++;
      }
   }

   if( errs ) return 0;  /* problems */

   if( g_opts.debug > 2 ) fprintf(stderr,"-d nifti header looks good\n");

   return 1;   /* looks good */
}